

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluDrawUtil.cpp
# Opt level: O3

void glu::drawFromBuffers
               (RenderContext *context,deUint32 program,int numVertexArrays,
               VertexArrayBinding *vertexArrays,PrimitiveList *primitives,DrawUtilCallback *callback
               )

{
  int *__v;
  _Base_ptr p_Var1;
  _Rb_tree_color _Var2;
  VertexComponentType VVar3;
  VertexComponentConversion VVar4;
  IndexType IVar5;
  void *pvVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  insert_iterator<std::vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>_>
  out;
  undefined8 uVar9;
  DrawUtilCallback *pDVar10;
  _Base_ptr p_Var11;
  bool bVar12;
  int iVar13;
  deUint32 dVar14;
  int iVar15;
  VertexAttributeDescriptor *__cur;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ObjectTraits *pOVar16;
  undefined4 extraout_var_01;
  VertexArrayBinding *pVVar17;
  ulong uVar18;
  pointer __src;
  pointer pVVar19;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  TestError *pTVar20;
  ulong uVar21;
  pointer pVVar22;
  ulong uVar23;
  uint uVar24;
  GLenum GVar25;
  _Base_ptr p_Var26;
  size_t __n;
  pointer pVVar27;
  long lVar28;
  PrimitiveList *pPVar29;
  pointer pVVar30;
  pointer pVVar31;
  uint uVar32;
  char *__n_00;
  GLenum GVar33;
  _Base_ptr p_Var34;
  _Base_ptr p_Var35;
  undefined8 *puVar36;
  _Vector_base<glu::(anonymous_namespace)::VertexAttributeDescriptor,_std::allocator<glu::(anonymous_namespace)::VertexAttributeDescriptor>_>
  *this;
  VertexArrayBinding *pVVar37;
  int iVar38;
  size_type __n_01;
  VertexArrayBinding *cur;
  VertexArrayBinding *pVVar39;
  VertexArrayPointer *pVVar40;
  vector<unsigned_char,_std::allocator<unsigned_char>_> localBuf;
  VertexBuffer vertexBuffer;
  vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_> bindingsWithLocations;
  vector<glu::VertexArrayPointer,_std::allocator<glu::VertexArrayPointer>_> srcPtrs;
  undefined8 in_stack_fffffffffffffeb8;
  VertexArrayBinding *pVVar41;
  pointer pVVar42;
  undefined4 in_stack_fffffffffffffec0;
  int iVar43;
  undefined4 in_stack_fffffffffffffec4;
  undefined1 local_118 [16];
  undefined1 local_108 [88];
  VertexBuffer local_b0;
  vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_> local_78;
  undefined1 local_60 [16];
  undefined8 *local_50;
  long local_48;
  long local_40;
  DrawUtilCallback *local_38;
  Functions *gl;
  
  local_38 = callback;
  iVar13 = (*context->_vptr_RenderContext[3])();
  gl = (Functions *)CONCAT44(extraout_var,iVar13);
  local_78.super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>.
  _M_impl.super__Vector_impl_data._M_start = (VertexArrayBinding *)0x0;
  local_78.super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>.
  _M_impl.super__Vector_impl_data._M_finish = (VertexArrayBinding *)0x0;
  local_78.super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  out.iter._M_current._0_4_ = in_stack_fffffffffffffec0;
  out.container =
       (vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_> *)
       in_stack_fffffffffffffeb8;
  out.iter._M_current._4_4_ = in_stack_fffffffffffffec4;
  (anonymous_namespace)::
  namedBindingsToProgramLocations<glu::VertexArrayBinding_const*,std::insert_iterator<std::vector<glu::VertexArrayBinding,std::allocator<glu::VertexArrayBinding>>>>
            ((_anonymous_namespace_ *)gl,(Functions *)(ulong)program,(deUint32)vertexArrays,
             vertexArrays + numVertexArrays,(VertexArrayBinding *)&local_78,out);
  bVar12 = (anonymous_namespace)::
           areVertexArrayLocationsValid<__gnu_cxx::__normal_iterator<glu::VertexArrayBinding*,std::vector<glu::VertexArrayBinding,std::allocator<glu::VertexArrayBinding>>>>
                     ((__normal_iterator<glu::VertexArrayBinding_*,_std::vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>_>
                       )local_78.
                        super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                      (__normal_iterator<glu::VertexArrayBinding_*,_std::vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>_>
                       )local_78.
                        super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>
                        ._M_impl.super__Vector_impl_data._M_finish);
  local_108._48_8_ = primitives;
  if (!bVar12) {
    pTVar20 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar20,(char *)0x0,
               "areVertexArrayLocationsValid(bindingsWithLocations.begin(), bindingsWithLocations.end())"
               ,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluDrawUtil.cpp"
               ,0x21a);
    __cxa_throw(pTVar20,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  lVar28 = (long)local_78.
                 super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)local_78.
                 super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>
                 ._M_impl.super__Vector_impl_data._M_start;
  pVVar39 = (VertexArrayBinding *)0x0;
  if (lVar28 != 0) {
    pVVar39 = local_78.
              super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>.
              _M_impl.super__Vector_impl_data._M_start;
  }
  iVar13 = (*context->_vptr_RenderContext[3])();
  pOVar16 = objectTraits(OBJECTTYPE_BUFFER);
  ObjectWrapper::ObjectWrapper
            ((ObjectWrapper *)(local_108 + 0x58),(Functions *)CONCAT44(extraout_var_00,iVar13),
             pOVar16);
  local_b0.m_layout.buffer = 0;
  local_b0.m_layout.attributes.
  super__Vector_base<glu::(anonymous_namespace)::VertexAttributeDescriptor,_std::allocator<glu::(anonymous_namespace)::VertexAttributeDescriptor>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_b0.m_layout.attributes.
  super__Vector_base<glu::(anonymous_namespace)::VertexAttributeDescriptor,_std::allocator<glu::(anonymous_namespace)::VertexAttributeDescriptor>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_b0.m_layout.attributes.
  super__Vector_base<glu::(anonymous_namespace)::VertexAttributeDescriptor,_std::allocator<glu::(anonymous_namespace)::VertexAttributeDescriptor>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar13 = (*context->_vptr_RenderContext[3])();
  local_40 = CONCAT44(extraout_var_01,iVar13);
  local_108._32_8_ = (lVar28 >> 4) * -0x3333333333333333;
  iVar13 = (int)local_108._32_8_;
  p_Var1 = (_Base_ptr)(local_118 + 8);
  local_118._8_4_ = _S_red;
  local_108._0_8_ = (_Base_ptr)0x0;
  local_108._24_8_ = 0;
  local_60._0_8_ = gl;
  local_108._40_8_ = (char *)(long)iVar13;
  local_108._8_8_ = p_Var1;
  local_108._16_8_ = p_Var1;
  if (iVar13 == 0) {
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
              ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
               local_118);
    pVVar31 = (pointer)0x0;
    pVVar42 = (pointer)0x0;
    __src = (pointer)0x0;
    __n_01 = 0;
  }
  else {
    pVVar17 = pVVar39 + iVar13;
    pVVar37 = pVVar39;
    do {
      if ((pVVar39->binding).type != TYPE_LOCATION) {
LAB_004ea4ed:
        std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
        ~_Rb_tree((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
                  local_118);
        pTVar20 = (TestError *)__cxa_allocate_exception(0x38);
        local_118._0_8_ = local_118 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_118,"Invalid vertex array locations","");
        tcu::TestError::TestError(pTVar20,(string *)local_118);
        __cxa_throw(pTVar20,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
      }
      __v = &(pVVar39->binding).location;
      if ((_Base_ptr)local_108._0_8_ != (_Base_ptr)0x0) {
        iVar13 = *__v;
        p_Var11 = (_Base_ptr)local_108._0_8_;
        p_Var35 = p_Var1;
        do {
          p_Var34 = p_Var35;
          p_Var26 = p_Var11;
          _Var2 = p_Var26[1]._M_color;
          p_Var35 = p_Var26;
          if ((int)_Var2 < iVar13) {
            p_Var35 = p_Var34;
          }
          p_Var11 = (&p_Var26->_M_left)[(int)_Var2 < iVar13];
        } while ((&p_Var26->_M_left)[(int)_Var2 < iVar13] != (_Base_ptr)0x0);
        if (p_Var35 != p_Var1) {
          if ((int)_Var2 < iVar13) {
            p_Var26 = p_Var34;
          }
          if ((int)p_Var26[1]._M_color <= iVar13) goto LAB_004ea4ed;
        }
      }
      std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
      _M_insert_unique<int_const&>
                ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                 local_118,__v);
      pVVar39 = pVVar39 + 1;
    } while (pVVar39 != pVVar17);
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
              ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
               local_118);
    pVVar42 = (pointer)0x0;
    pVVar31 = (pointer)0x0;
    iVar13 = 0;
    pVVar27 = (pointer)0x0;
    pVVar39 = pVVar37;
    pVVar41 = pVVar37;
    do {
      VVar3 = (pVVar37->pointer).componentType;
      iVar15 = 0;
      if ((ulong)VVar3 < 9) {
        iVar15 = *(int *)(&DAT_00672f54 + (ulong)VVar3 * 4);
      }
      uVar24 = iVar13 + 3U & 0xfffffffc;
      iVar43 = (pVVar37->pointer).numComponents;
      uVar32 = (pVVar37->pointer).numElements;
      iVar38 = (pVVar37->binding).location;
      VVar4 = (pVVar37->pointer).convert;
      if (pVVar31 == pVVar42) {
        local_108._56_4_ = iVar38;
        local_108._64_4_ = VVar4;
        local_108._72_8_ = CONCAT44(local_108._76_4_,iVar13 + 3U) & 0xfffffffffffffffc;
        local_108._80_4_ = iVar15;
        uVar23 = (long)pVVar42 - (long)pVVar27;
        if (uVar23 == 0x7fffffffffffffe0) {
          std::__throw_length_error("vector::_M_realloc_insert");
        }
        uVar18 = (long)uVar23 >> 5;
        uVar21 = uVar18;
        if (pVVar42 == pVVar27) {
          uVar21 = 1;
        }
        this = (_Vector_base<glu::(anonymous_namespace)::VertexAttributeDescriptor,_std::allocator<glu::(anonymous_namespace)::VertexAttributeDescriptor>_>
                *)(uVar21 + uVar18);
        if ((_Vector_base<glu::(anonymous_namespace)::VertexAttributeDescriptor,_std::allocator<glu::(anonymous_namespace)::VertexAttributeDescriptor>_>
             *)0x3fffffffffffffe < this) {
          this = (_Vector_base<glu::(anonymous_namespace)::VertexAttributeDescriptor,_std::allocator<glu::(anonymous_namespace)::VertexAttributeDescriptor>_>
                  *)0x3ffffffffffffff;
        }
        if (CARRY8(uVar21,uVar18)) {
          this = (_Vector_base<glu::(anonymous_namespace)::VertexAttributeDescriptor,_std::allocator<glu::(anonymous_namespace)::VertexAttributeDescriptor>_>
                  *)0x3ffffffffffffff;
        }
        __src = std::
                _Vector_base<glu::(anonymous_namespace)::VertexAttributeDescriptor,_std::allocator<glu::(anonymous_namespace)::VertexAttributeDescriptor>_>
                ::_M_allocate(this,(ulong)uVar32);
        *(undefined4 *)((long)__src + uVar23) = local_108._56_4_;
        *(VertexComponentType *)((long)__src + uVar23 + 4) = VVar3;
        *(undefined4 *)((long)__src + uVar23 + 8) = local_108._64_4_;
        *(int *)((long)__src + uVar23 + 0xc) = iVar43;
        *(uint *)((long)__src + uVar23 + 0x10) = uVar32;
        *(undefined4 *)((long)__src + uVar23 + 0x14) = 0;
        *(void **)((long)__src + uVar23 + 0x18) = (void *)(long)(int)uVar24;
        pVVar31 = __src;
        for (pVVar22 = pVVar27; pVVar42 != pVVar22; pVVar22 = pVVar22 + 1) {
          iVar15 = pVVar22->location;
          VVar3 = pVVar22->componentType;
          VVar4 = pVVar22->convert;
          iVar38 = pVVar22->numComponents;
          iVar13 = pVVar22->stride;
          pvVar6 = pVVar22->pointer;
          pVVar31->numElements = pVVar22->numElements;
          pVVar31->stride = iVar13;
          pVVar31->pointer = pvVar6;
          pVVar31->location = iVar15;
          pVVar31->componentType = VVar3;
          pVVar31->convert = VVar4;
          pVVar31->numComponents = iVar38;
          pVVar31 = pVVar31 + 1;
        }
        pVVar39 = pVVar41;
        if (pVVar27 != (pointer)0x0) {
          operator_delete(pVVar27,uVar23);
          pVVar39 = pVVar41;
        }
        pVVar42 = __src + (long)this;
        iVar15 = local_108._80_4_;
        uVar24 = local_108._72_4_;
        pVVar41 = pVVar39;
      }
      else {
        pVVar31->location = iVar38;
        pVVar31->componentType = VVar3;
        pVVar31->convert = VVar4;
        pVVar31->numComponents = iVar43;
        pVVar31->numElements = uVar32;
        pVVar31->stride = 0;
        pVVar31->pointer = (void *)(long)(int)uVar24;
        __src = pVVar27;
      }
      pVVar31 = pVVar31 + 1;
      iVar13 = iVar43 * iVar15 * uVar32 + uVar24;
      pVVar37 = pVVar37 + 1;
      pVVar27 = __src;
    } while (pVVar37 != pVVar17);
    __n_01 = (size_type)iVar13;
    gl = (Functions *)local_60._0_8_;
  }
  __n_00 = (char *)local_108._40_8_;
  std::vector<glu::VertexArrayPointer,_std::allocator<glu::VertexArrayPointer>_>::vector
            ((vector<glu::VertexArrayPointer,_std::allocator<glu::VertexArrayPointer>_> *)
             (local_60 + 8),local_108._40_8_,(allocator_type *)local_118);
  uVar9 = local_60._8_8_;
  if (0 < (int)(uint)local_108._32_8_) {
    uVar23 = (ulong)((uint)local_108._32_8_ & 0x7fffffff);
    pVVar40 = &pVVar39->pointer;
    puVar36 = (undefined8 *)local_60._8_8_;
    do {
      uVar7 = *(undefined8 *)pVVar40;
      uVar8 = *(undefined8 *)&pVVar40->numComponents;
      pvVar6 = pVVar40->data;
      puVar36[2] = *(undefined8 *)&pVVar40->stride;
      puVar36[3] = pvVar6;
      *puVar36 = uVar7;
      puVar36[1] = uVar8;
      puVar36 = puVar36 + 4;
      pVVar40 = (VertexArrayPointer *)((long)(pVVar40 + 2) + 0x10);
      uVar23 = uVar23 - 1;
    } while (uVar23 != 0);
  }
  if ((undefined8 *)local_60._8_8_ == local_50) {
    uVar23 = (long)pVVar31 - (long)__src;
    pPVar29 = (PrimitiveList *)local_108._48_8_;
    pVVar27 = pVVar42;
  }
  else {
    local_108._40_4_ = local_b0.super_Buffer.super_ObjectWrapper.m_object;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_118,__n_01,
               (allocator_type *)&stack0xfffffffffffffec7);
    local_108._32_8_ = (long)pVVar31 - (long)__src;
    iVar13 = (int)((ulong)local_108._32_8_ >> 5);
    if (0 < iVar13) {
      local_108._64_8_ = 1;
      if (1 < (long)iVar13) {
        local_108._64_8_ = (long)iVar13;
      }
      uVar23 = 0;
      local_108._56_8_ = pVVar31;
      do {
        uVar7 = local_118._0_8_;
        iVar13 = 0;
        if ((ulong)__src[uVar23].componentType < 9) {
          iVar13 = *(int *)(&DAT_00672f54 + (ulong)__src[uVar23].componentType * 4);
        }
        puVar36 = (undefined8 *)(uVar23 * 0x20 + uVar9);
        iVar15 = __src[uVar23].stride;
        iVar13 = iVar13 * __src[uVar23].numComponents;
        iVar43 = *(int *)(puVar36 + 2);
        local_108._72_8_ = uVar23;
        if ((iVar43 == 0 || iVar43 == iVar13) && (iVar15 == 0 || iVar15 == iVar13)) {
          memcpy((pointer)(local_118._0_8_ + (long)__src[uVar23].pointer),(void *)puVar36[3],
                 (long)(iVar13 * __src[uVar23].numElements));
        }
        else {
          if (iVar15 == 0) {
            iVar15 = iVar13;
          }
          if (iVar43 == 0) {
            iVar43 = iVar13;
          }
          if (0 < __src[uVar23].numElements) {
            local_108._80_8_ = SEXT48(iVar13);
            iVar13 = 0;
            iVar38 = 0;
            lVar28 = 0;
            do {
              memcpy((pointer)((long)__src[uVar23].pointer + uVar7) + iVar13,
                     (void *)(puVar36[3] + (long)iVar38),local_108._80_8_);
              lVar28 = lVar28 + 1;
              iVar38 = iVar38 + iVar43;
              iVar13 = iVar13 + iVar15;
            } while (lVar28 < __src[uVar23].numElements);
          }
        }
        uVar23 = local_108._72_8_ + 1;
        pVVar31 = (pointer)local_108._56_8_;
      } while (uVar23 != local_108._64_8_);
    }
    lVar28 = local_40;
    pVVar27 = pVVar42;
    (**(code **)(local_40 + 0x40))(0x8892,local_108._40_8_ & 0xffffffff);
    (**(code **)(lVar28 + 0x150))
              (0x8892,(long)(local_118._8_4_ - (int)local_118._0_8_),local_118._0_8_,0x88e4);
    (**(code **)(lVar28 + 0x40))(0x8892,0);
    dVar14 = (**(code **)(lVar28 + 0x800))();
    __n_00 = "Uploading buffer data failed";
    checkError(dVar14,"Uploading buffer data failed",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluDrawUtil.cpp"
               ,0x14e);
    gl = (Functions *)local_60._0_8_;
    pPVar29 = (PrimitiveList *)local_108._48_8_;
    uVar23 = local_108._32_8_;
    if ((Functions *)local_118._0_8_ != (Functions *)0x0) {
      __n_00 = (char *)(local_108._0_8_ - local_118._0_8_);
      operator_delete((void *)local_118._0_8_,(ulong)__n_00);
      uVar23 = local_108._32_8_;
    }
  }
  local_b0.m_layout.buffer = local_b0.super_Buffer.super_ObjectWrapper.m_object;
  if ((ulong)((long)local_b0.m_layout.attributes.
                    super__Vector_base<glu::(anonymous_namespace)::VertexAttributeDescriptor,_std::allocator<glu::(anonymous_namespace)::VertexAttributeDescriptor>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
             (long)local_b0.m_layout.attributes.
                   super__Vector_base<glu::(anonymous_namespace)::VertexAttributeDescriptor,_std::allocator<glu::(anonymous_namespace)::VertexAttributeDescriptor>_>
                   ._M_impl.super__Vector_impl_data._M_start) < uVar23) {
    pVVar19 = std::
              _Vector_base<glu::(anonymous_namespace)::VertexAttributeDescriptor,_std::allocator<glu::(anonymous_namespace)::VertexAttributeDescriptor>_>
              ::_M_allocate((_Vector_base<glu::(anonymous_namespace)::VertexAttributeDescriptor,_std::allocator<glu::(anonymous_namespace)::VertexAttributeDescriptor>_>
                             *)((long)uVar23 >> 5),(size_t)__n_00);
    pVVar42 = pVVar19;
    for (pVVar22 = __src; pVVar22 != pVVar31; pVVar22 = pVVar22 + 1) {
      iVar15 = pVVar22->location;
      VVar3 = pVVar22->componentType;
      VVar4 = pVVar22->convert;
      iVar43 = pVVar22->numComponents;
      iVar13 = pVVar22->stride;
      pvVar6 = pVVar22->pointer;
      pVVar42->numElements = pVVar22->numElements;
      pVVar42->stride = iVar13;
      pVVar42->pointer = pvVar6;
      pVVar42->location = iVar15;
      pVVar42->componentType = VVar3;
      pVVar42->convert = VVar4;
      pVVar42->numComponents = iVar43;
      pVVar42 = pVVar42 + 1;
    }
    pVVar42 = pVVar27;
    if (local_b0.m_layout.attributes.
        super__Vector_base<glu::(anonymous_namespace)::VertexAttributeDescriptor,_std::allocator<glu::(anonymous_namespace)::VertexAttributeDescriptor>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_b0.m_layout.attributes.
                      super__Vector_base<glu::(anonymous_namespace)::VertexAttributeDescriptor,_std::allocator<glu::(anonymous_namespace)::VertexAttributeDescriptor>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_b0.m_layout.attributes.
                            super__Vector_base<glu::(anonymous_namespace)::VertexAttributeDescriptor,_std::allocator<glu::(anonymous_namespace)::VertexAttributeDescriptor>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_b0.m_layout.attributes.
                            super__Vector_base<glu::(anonymous_namespace)::VertexAttributeDescriptor,_std::allocator<glu::(anonymous_namespace)::VertexAttributeDescriptor>_>
                            ._M_impl.super__Vector_impl_data._M_start);
      pVVar42 = pVVar27;
    }
    local_b0.m_layout.attributes.
    super__Vector_base<glu::(anonymous_namespace)::VertexAttributeDescriptor,_std::allocator<glu::(anonymous_namespace)::VertexAttributeDescriptor>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)((long)&pVVar19->location + uVar23);
    local_b0.m_layout.attributes.
    super__Vector_base<glu::(anonymous_namespace)::VertexAttributeDescriptor,_std::allocator<glu::(anonymous_namespace)::VertexAttributeDescriptor>_>
    ._M_impl.super__Vector_impl_data._M_start = pVVar19;
  }
  else {
    __n = (long)local_b0.m_layout.attributes.
                super__Vector_base<glu::(anonymous_namespace)::VertexAttributeDescriptor,_std::allocator<glu::(anonymous_namespace)::VertexAttributeDescriptor>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)local_b0.m_layout.attributes.
                super__Vector_base<glu::(anonymous_namespace)::VertexAttributeDescriptor,_std::allocator<glu::(anonymous_namespace)::VertexAttributeDescriptor>_>
                ._M_impl.super__Vector_impl_data._M_start;
    if (__n < uVar23) {
      if (local_b0.m_layout.attributes.
          super__Vector_base<glu::(anonymous_namespace)::VertexAttributeDescriptor,_std::allocator<glu::(anonymous_namespace)::VertexAttributeDescriptor>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          local_b0.m_layout.attributes.
          super__Vector_base<glu::(anonymous_namespace)::VertexAttributeDescriptor,_std::allocator<glu::(anonymous_namespace)::VertexAttributeDescriptor>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        memmove(local_b0.m_layout.attributes.
                super__Vector_base<glu::(anonymous_namespace)::VertexAttributeDescriptor,_std::allocator<glu::(anonymous_namespace)::VertexAttributeDescriptor>_>
                ._M_impl.super__Vector_impl_data._M_start,__src,__n);
        __n = (long)local_b0.m_layout.attributes.
                    super__Vector_base<glu::(anonymous_namespace)::VertexAttributeDescriptor,_std::allocator<glu::(anonymous_namespace)::VertexAttributeDescriptor>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_b0.m_layout.attributes.
                    super__Vector_base<glu::(anonymous_namespace)::VertexAttributeDescriptor,_std::allocator<glu::(anonymous_namespace)::VertexAttributeDescriptor>_>
                    ._M_impl.super__Vector_impl_data._M_start;
      }
      for (pVVar27 = (pointer)((long)&__src->location + __n); pVVar27 != pVVar31;
          pVVar27 = pVVar27 + 1) {
        iVar15 = pVVar27->location;
        VVar3 = pVVar27->componentType;
        VVar4 = pVVar27->convert;
        iVar43 = pVVar27->numComponents;
        iVar13 = pVVar27->stride;
        pvVar6 = pVVar27->pointer;
        (local_b0.m_layout.attributes.
         super__Vector_base<glu::(anonymous_namespace)::VertexAttributeDescriptor,_std::allocator<glu::(anonymous_namespace)::VertexAttributeDescriptor>_>
         ._M_impl.super__Vector_impl_data._M_finish)->numElements = pVVar27->numElements;
        (local_b0.m_layout.attributes.
         super__Vector_base<glu::(anonymous_namespace)::VertexAttributeDescriptor,_std::allocator<glu::(anonymous_namespace)::VertexAttributeDescriptor>_>
         ._M_impl.super__Vector_impl_data._M_finish)->stride = iVar13;
        (local_b0.m_layout.attributes.
         super__Vector_base<glu::(anonymous_namespace)::VertexAttributeDescriptor,_std::allocator<glu::(anonymous_namespace)::VertexAttributeDescriptor>_>
         ._M_impl.super__Vector_impl_data._M_finish)->pointer = pvVar6;
        (local_b0.m_layout.attributes.
         super__Vector_base<glu::(anonymous_namespace)::VertexAttributeDescriptor,_std::allocator<glu::(anonymous_namespace)::VertexAttributeDescriptor>_>
         ._M_impl.super__Vector_impl_data._M_finish)->location = iVar15;
        (local_b0.m_layout.attributes.
         super__Vector_base<glu::(anonymous_namespace)::VertexAttributeDescriptor,_std::allocator<glu::(anonymous_namespace)::VertexAttributeDescriptor>_>
         ._M_impl.super__Vector_impl_data._M_finish)->componentType = VVar3;
        (local_b0.m_layout.attributes.
         super__Vector_base<glu::(anonymous_namespace)::VertexAttributeDescriptor,_std::allocator<glu::(anonymous_namespace)::VertexAttributeDescriptor>_>
         ._M_impl.super__Vector_impl_data._M_finish)->convert = VVar4;
        (local_b0.m_layout.attributes.
         super__Vector_base<glu::(anonymous_namespace)::VertexAttributeDescriptor,_std::allocator<glu::(anonymous_namespace)::VertexAttributeDescriptor>_>
         ._M_impl.super__Vector_impl_data._M_finish)->numComponents = iVar43;
        local_b0.m_layout.attributes.
        super__Vector_base<glu::(anonymous_namespace)::VertexAttributeDescriptor,_std::allocator<glu::(anonymous_namespace)::VertexAttributeDescriptor>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             local_b0.m_layout.attributes.
             super__Vector_base<glu::(anonymous_namespace)::VertexAttributeDescriptor,_std::allocator<glu::(anonymous_namespace)::VertexAttributeDescriptor>_>
             ._M_impl.super__Vector_impl_data._M_finish + 1;
      }
    }
    else if (pVVar31 != __src) {
      memmove(local_b0.m_layout.attributes.
              super__Vector_base<glu::(anonymous_namespace)::VertexAttributeDescriptor,_std::allocator<glu::(anonymous_namespace)::VertexAttributeDescriptor>_>
              ._M_impl.super__Vector_impl_data._M_start,__src,uVar23);
    }
  }
  local_b0.m_layout.attributes.
  super__Vector_base<glu::(anonymous_namespace)::VertexAttributeDescriptor,_std::allocator<glu::(anonymous_namespace)::VertexAttributeDescriptor>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pointer)((long)&(local_b0.m_layout.attributes.
                         super__Vector_base<glu::(anonymous_namespace)::VertexAttributeDescriptor,_std::allocator<glu::(anonymous_namespace)::VertexAttributeDescriptor>_>
                         ._M_impl.super__Vector_impl_data._M_start)->location + uVar23);
  if ((undefined8 *)local_60._8_8_ != (undefined8 *)0x0) {
    operator_delete((void *)local_60._8_8_,local_48 - local_60._8_8_);
  }
  pDVar10 = local_38;
  if (__src != (pointer)0x0) {
    operator_delete(__src,(long)pVVar42 - (long)__src);
  }
  (*gl->bindBuffer)(0x8892,local_b0.m_layout.buffer);
  for (pVVar31 = local_b0.m_layout.attributes.
                 super__Vector_base<glu::(anonymous_namespace)::VertexAttributeDescriptor,_std::allocator<glu::(anonymous_namespace)::VertexAttributeDescriptor>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      pVVar31 !=
      local_b0.m_layout.attributes.
      super__Vector_base<glu::(anonymous_namespace)::VertexAttributeDescriptor,_std::allocator<glu::(anonymous_namespace)::VertexAttributeDescriptor>_>
      ._M_impl.super__Vector_impl_data._M_finish; pVVar31 = pVVar31 + 1) {
    anon_unknown_4::setVertexAttribPointer(gl,pVVar31);
  }
  (*gl->bindBuffer)(0x8892,0);
  pvVar6 = pPVar29->indices;
  if (pvVar6 == (void *)0x0) {
    if (pDVar10 != (DrawUtilCallback *)0x0) {
      (**pDVar10->_vptr_DrawUtilCallback)();
    }
    GVar33 = 0;
    if ((ulong)pPVar29->type < 8) {
      GVar33 = *(GLenum *)(&DAT_00672f84 + (ulong)pPVar29->type * 4);
    }
    (*gl->drawArrays)(GVar33,0,pPVar29->numElements);
    if (pDVar10 != (DrawUtilCallback *)0x0) {
      (*pDVar10->_vptr_DrawUtilCallback[1])(pDVar10);
    }
  }
  else {
    iVar13 = pPVar29->numElements;
    IVar5 = pPVar29->indexType;
    iVar15 = (*context->_vptr_RenderContext[3])();
    pOVar16 = objectTraits(OBJECTTYPE_BUFFER);
    ObjectWrapper::ObjectWrapper
              ((ObjectWrapper *)local_118,(Functions *)CONCAT44(extraout_var_02,iVar15),pOVar16);
    iVar15 = (*context->_vptr_RenderContext[3])();
    lVar28 = CONCAT44(extraout_var_03,iVar15);
    (**(code **)(lVar28 + 0x40))(0x8893,local_108._0_8_ & 0xffffffff);
    iVar15 = 0;
    if (IVar5 < INDEXTYPE_LAST) {
      iVar15 = *(int *)(&DAT_00672f78 + (ulong)IVar5 * 4);
    }
    (**(code **)(lVar28 + 0x150))(0x8893,(long)(iVar15 * iVar13),pvVar6,0x88e4);
    (**(code **)(lVar28 + 0x40))(0x8893,0);
    dVar14 = (**(code **)(lVar28 + 0x800))();
    checkError(dVar14,"Uploading index data failed",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluDrawUtil.cpp"
               ,0x17e);
    (*gl->bindBuffer)(0x8893,local_108._0_4_);
    if (pDVar10 != (DrawUtilCallback *)0x0) {
      (**pDVar10->_vptr_DrawUtilCallback)(pDVar10);
    }
    GVar33 = 0;
    if ((ulong)*(PrimitiveType *)local_108._48_8_ < 8) {
      GVar33 = *(GLenum *)(&DAT_00672f84 + (ulong)*(PrimitiveType *)local_108._48_8_ * 4);
    }
    GVar25 = *(IndexType *)(local_108._48_8_ + 8) * 2 + 0x1401;
    if (INDEXTYPE_UINT32 < *(IndexType *)(local_108._48_8_ + 8)) {
      GVar25 = 0;
    }
    (*gl->drawElements)(GVar33,*(int *)(local_108._48_8_ + 4),GVar25,(void *)0x0);
    if (pDVar10 != (DrawUtilCallback *)0x0) {
      (*pDVar10->_vptr_DrawUtilCallback[1])(pDVar10);
    }
    (*gl->bindBuffer)(0x8893,0);
    ObjectWrapper::~ObjectWrapper((ObjectWrapper *)local_118);
  }
  anon_unknown_4::VertexBuffer::~VertexBuffer((VertexBuffer *)(local_108 + 0x58));
  for (pVVar30 = local_78.
                 super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      pVVar30 !=
      local_78.super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>
      ._M_impl.super__Vector_impl_data._M_finish; pVVar30 = pVVar30 + 1) {
    (*gl->disableVertexAttribArray)((pVVar30->binding).location);
  }
  std::vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>::~vector(&local_78)
  ;
  return;
}

Assistant:

void drawFromBuffers (const RenderContext& context, deUint32 program, int numVertexArrays, const VertexArrayBinding* vertexArrays, const PrimitiveList& primitives, DrawUtilCallback* callback)
{
	const glw::Functions&				gl		= context.getFunctions();
	std::vector<VertexArrayBinding>		bindingsWithLocations;

	DE_ASSERT(isDrawCallValid(numVertexArrays, vertexArrays, primitives));
	DE_ASSERT(isProgramActive(context, program));

	// Lower bindings to locations.
	namedBindingsToProgramLocations(gl, program, vertexArrays, vertexArrays+numVertexArrays, std::inserter(bindingsWithLocations, bindingsWithLocations.begin()));

	TCU_CHECK(areVertexArrayLocationsValid(bindingsWithLocations.begin(), bindingsWithLocations.end()));

	// Create buffers for duration of draw call.
	{
		VertexBuffer vertexBuffer (context, (int)bindingsWithLocations.size(), (bindingsWithLocations.empty()) ? (DE_NULL) : (&bindingsWithLocations[0]));

		// Set state.
		setVertexBufferAttributes(gl, vertexBuffer.getDescriptor());

		if (primitives.indices)
		{
			IndexBuffer indexBuffer(context, primitives.indexType, primitives.numElements, primitives.indices);

			gl.bindBuffer(GL_ELEMENT_ARRAY_BUFFER, *indexBuffer);

			if (callback)
				callback->beforeDrawCall();

			drawIndexed(gl, primitives.type, primitives.numElements, primitives.indexType, 0);

			if (callback)
				callback->afterDrawCall();

			gl.bindBuffer(GL_ELEMENT_ARRAY_BUFFER, 0);
		}
		else
		{
			if (callback)
				callback->beforeDrawCall();

			drawNonIndexed(gl, primitives.type, primitives.numElements);

			if (callback)
				callback->afterDrawCall();
		}
	}

	// Disable attribute arrays or otherwise someone later on might get crash thanks to invalid pointers.
	for (std::vector<VertexArrayBinding>::const_iterator vaIter = bindingsWithLocations.begin(); vaIter != bindingsWithLocations.end(); ++vaIter)
		gl.disableVertexAttribArray(vaIter->binding.location);
}